

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatbase.c
# Opt level: O2

int ecx_LRW(ecx_portt *port,uint32 LogAdr,uint16 length,void *data,int timeout)

{
  uint uVar1;
  int iVar2;
  uint idx;
  
  uVar1 = ecx_getindex(port);
  idx = uVar1 & 0xff;
  ecx_setupdatagram(port,port->txbuf + idx,'\f',(uint8)uVar1,(uint16)LogAdr,(uint16)(LogAdr >> 0x10)
                    ,length,data);
  iVar2 = ecx_srconfirm(port,idx,timeout);
  if ((0 < iVar2) && (port->rxbuf[idx][2] == '\f')) {
    memcpy(data,port->rxbuf[idx] + 0xc,(ulong)length);
  }
  ecx_setbufstat(port,idx,0);
  return iVar2;
}

Assistant:

int ecx_LRW(ecx_portt *port, uint32 LogAdr, uint16 length, void *data, int timeout)
{
   uint8 idx;
   int wkc;

   idx = ecx_getindex(port);
   ecx_setupdatagram(port, &(port->txbuf[idx]), EC_CMD_LRW, idx, LO_WORD(LogAdr), HI_WORD(LogAdr), length, data);
   wkc = ecx_srconfirm(port, idx, timeout);
   if ((wkc > 0) && (port->rxbuf[idx][EC_CMDOFFSET] == EC_CMD_LRW))
   {
      memcpy(data, &(port->rxbuf[idx][EC_HEADERSIZE]), length);
   }
   ecx_setbufstat(port, idx, EC_BUF_EMPTY);

   return wkc;
}